

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O2

void __thiscall
Am_Input_Char::Am_Input_Char
          (Am_Input_Char *this,short c,bool shf,bool ctrl,bool mt,Am_Button_Down down,
          Am_Click_Count click,bool any_mod)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  
  if ((char_map == (Am_Symbol_Table *)0x0) || (click_count_map == (Am_Symbol_Table *)0x0)) {
    Am_Initialize_Char_Map();
  }
  this->code = c;
  uVar1 = (ushort)((click & 0xf) << 8) | *(ushort *)&this->field_0x2 & 0xf000;
  uVar2 = (ushort)shf + (ushort)ctrl * 2 + (ushort)mt * 4 + (ushort)any_mod * 8;
  uVar3 = (ushort)((down & 0xf) << 4);
  *(ushort *)&this->field_0x2 = uVar2 | uVar3 | uVar1;
  if ((ushort)(c - 0x61U) < 0x1a) {
    if (shf) {
      this->code = c + -0x20;
    }
  }
  else {
    bVar4 = Fix_Shift_For_Code(c,shf);
    *(ushort *)&this->field_0x2 = uVar2 & 0xfffe | uVar3 | uVar1 | (ushort)bVar4;
  }
  return;
}

Assistant:

Am_Input_Char::Am_Input_Char(short c, bool shf, bool ctrl, bool mt,
                             Am_Button_Down down, Am_Click_Count click,
                             bool any_mod)
{
  if (char_map == nullptr || click_count_map == nullptr)
    Am_Initialize_Char_Map();

  code = c;
  shift = shf;
  control = ctrl;
  meta = mt;
  button_down = down;
  click_count = click;
  any_modifier = any_mod;

  // make sure the shift bit is consistent with the character
  if ((code >= 'a') && (code <= 'z')) {

    if (shift) //convert to upper case
      code = code + ('A' - 'a');
  } else
    shift = Fix_Shift_For_Code(code, shift);
}